

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusAnalyzerResults.cpp
# Opt level: O2

void BitFieldToDescAll(BitFieldDesc *bfld,U64 val,
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *desc)

{
  char **ppcVar1;
  allocator local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(desc);
  for (ppcVar1 = &bfld->bit_name; *ppcVar1 != (char *)0x0; ppcVar1 = ppcVar1 + 2) {
    std::__cxx11::string::string((string *)&local_50,*ppcVar1,&local_51);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)desc,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::append
              ((char *)((desc->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish + -1));
    std::__cxx11::string::append
              ((char *)((desc->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish + -1));
  }
  return;
}

Assistant:

void BitFieldToDescAll( const BitFieldDesc* bfld, U64 val, std::vector<std::string>& desc )
{
    desc.clear();

    while( bfld->bit_name )
    {
        desc.push_back( bfld->bit_name );
        desc.back() += "=";

        if( val & U16( 1 << bfld->bit_number ) )
            desc.back() += "1";
        else
            desc.back() += "0";

        ++bfld;
    }
}